

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O1

Property * Shell::Property::scan(UnitList *units)

{
  long lVar1;
  long lVar2;
  Property *this;
  ulong uVar3;
  ulong uVar4;
  
  lVar2 = DAT_00b7e1b0;
  lVar1 = *(long *)(DAT_00b7e1b0 + 0x60);
  uVar3 = *(long *)(DAT_00b7e1b0 + 0x68) - lVar1;
  if ((uVar3 & 0x7fffffff8) != 0) {
    uVar4 = 0;
    do {
      *(undefined8 *)(*(long *)(lVar1 + uVar4 * 8) + 0x38) = 0;
      uVar4 = uVar4 + 1;
    } while ((uVar3 >> 3 & 0xffffffff) != uVar4);
  }
  lVar1 = *(long *)(lVar2 + 0x80);
  uVar3 = *(long *)(lVar2 + 0x88) - lVar1;
  if ((uVar3 & 0x7fffffff8) != 0) {
    uVar4 = 0;
    do {
      *(undefined8 *)(*(long *)(lVar1 + uVar4 * 8) + 0x38) = 0;
      uVar4 = uVar4 + 1;
    } while ((uVar3 >> 3 & 0xffffffff) != uVar4);
  }
  this = (Property *)::operator_new(0x118);
  Property(this);
  add(this,units);
  return this;
}

Assistant:

Property* Property::scan(UnitList* units)
{
  // a bit of a hack, these counts belong in Property
  for(unsigned f=0;f<env.signature->functions();f++){ 
    env.signature->getFunction(f)->resetUsageCnt(); 
    env.signature->getFunction(f)->resetUnitUsageCnt(); 
   }
  for(unsigned p=0;p<env.signature->predicates();p++){ 
    env.signature->getPredicate(p)->resetUsageCnt(); 
    env.signature->getPredicate(p)->resetUnitUsageCnt(); 
   }

  Property* prop = new Property;
  prop->add(units);
  return prop;
}